

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::item::assign
          (item *this,entry *v,span<const_char> salt,sequence_number seq,public_key *pk,
          secret_key *sk)

{
  iterator out;
  char *pcVar1;
  span<const_char> local_590;
  span<const_char> local_580;
  span<const_char> local_570;
  signature local_560;
  int local_520;
  undefined1 local_519;
  int bsize;
  array<char,_1249UL> buffer;
  public_key *pk_local;
  entry *v_local;
  item *this_local;
  sequence_number seq_local;
  span<const_char> salt_local;
  
  seq_local.value = (int64_t)salt.m_ptr;
  buffer._M_elems._1241_8_ = pk;
  out = std::array<char,_1249UL>::begin((array<char,_1249UL> *)&local_519);
  local_520 = bencode<char*>(out,v);
  span<char_const>::span<char,1249ul>
            ((span<char_const> *)&local_580,(array<char,_1249UL> *)&local_519);
  local_570 = span<const_char>::first(&local_580,(long)local_520);
  span<char_const>::span<libtorrent::span<char_const>,char_const,void>
            ((span<char_const> *)&local_590,(span<const_char> *)&seq_local);
  sign_mutable_item(&local_560,local_570,local_590,seq,(public_key *)buffer._M_elems._1241_8_,sk);
  memcpy(&this->m_sig,&local_560,0x40);
  pcVar1 = span<const_char>::data((span<const_char> *)&seq_local);
  span<const_char>::size((span<const_char> *)&seq_local);
  std::__cxx11::string::assign((char *)&this->m_salt,(ulong)pcVar1);
  *(undefined8 *)(this->m_pk).bytes._M_elems = *(undefined8 *)buffer._M_elems._1241_8_;
  *(undefined8 *)((this->m_pk).bytes._M_elems + 8) = *(undefined8 *)(buffer._M_elems._1241_8_ + 8);
  *(undefined8 *)((this->m_pk).bytes._M_elems + 0x10) =
       *(undefined8 *)(buffer._M_elems._1241_8_ + 0x10);
  *(undefined8 *)((this->m_pk).bytes._M_elems + 0x18) =
       *(undefined8 *)(buffer._M_elems._1241_8_ + 0x18);
  sequence_number::operator=(&this->m_seq,seq);
  this->m_mutable = true;
  entry::operator=(&this->m_value,v);
  return;
}

Assistant:

void item::assign(entry v, span<char const> salt
	, sequence_number const seq, public_key const& pk, secret_key const& sk)
{
	std::array<char, MAX_DHT_MUTABLE_DATA_LENGTH> buffer;
	int const bsize = bencode(buffer.begin(), v);
	TORRENT_ASSERT(bsize <= static_cast<int>(MAX_DHT_MUTABLE_DATA_LENGTH));
	m_sig = sign_mutable_item(span<char const>(buffer).first(bsize)
		, salt, seq, pk, sk);
	m_salt.assign(salt.data(), static_cast<std::size_t>(salt.size()));
	m_pk = pk;
	m_seq = seq;
	m_mutable = true;
	m_value = std::move(v);
}